

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_linkage_test.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  initializer_list<chaiscript::Options> __l;
  ChaiScript_Basic chai;
  allocator_type local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  local_3b0;
  undefined1 local_3a8 [32];
  Exception_Handler local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  ChaiScript_Basic local_340;
  
  create_chaiscript_stdlib();
  create_chaiscript_parser();
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388.
  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x300000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_388;
  std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::vector
            ((vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_3d0,__l,
             &local_3d1);
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (&local_340,(ModulePtr *)local_3a8,&local_3b0,&local_358,&local_378,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_3d0);
  if (local_3d0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    local_3d0.field_2._M_allocated_capacity - (long)local_3d0._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  if ((tuple<chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
       )local_3b0._M_t.
        super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
        ._M_t.
        super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
        .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl !=
      (_Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_3b0._M_t.
        super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
        ._M_t.
        super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
        .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl)[4]
    )();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
  }
  local_388.
  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)do_something;
  chaiscript::dispatch::detail::make_callable_impl<int(*)(int),false,false,false,false,int,int>
            (local_3a8);
  paVar1 = &local_3d0.field_2;
  local_3d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"do_something","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_3d0);
  chaiscript::detail::Dispatch_Engine::add_function
            (&local_340.m_engine,(Proxy_Function *)local_3a8,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
  }
  local_3d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"do_something(101)","");
  local_388.
  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_388.
  super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3a8._0_8_ = (element_type *)(local_3a8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"__EVAL__","");
  iVar2 = chaiscript::ChaiScript_Basic::eval<int>
                    (&local_340,&local_3d0,&local_388,(string *)local_3a8);
  if ((element_type *)local_3a8._0_8_ != (element_type *)(local_3a8 + 0x10)) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  if (local_388.
      super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.
               super___shared_ptr<chaiscript::detail::Exception_Handler_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&local_340);
  return (int)(iVar2 != 1);
}

Assistant:

int main() {
  chaiscript::ChaiScript_Basic chai(create_chaiscript_stdlib(), create_chaiscript_parser());
  chai.add(chaiscript::fun(&do_something), "do_something");

  return chai.eval<int>("do_something(101)") == 101 % 2 ? EXIT_SUCCESS : EXIT_FAILURE;
}